

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O1

void __thiscall
Memory::PreReservedVirtualAllocWrapper::~PreReservedVirtualAllocWrapper
          (PreReservedVirtualAllocWrapper *this)

{
  LPVOID pvVar1;
  uint uVar2;
  
  if (this->preReservedStartAddress != (LPVOID)0x0) {
    VirtualFree(this->preReservedStartAddress,0,0x8000);
    pvVar1 = this->preReservedStartAddress;
    uVar2 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
    Output::Trace(PreReservedHeapAllocPhase,
                  L"MEM_RELEASE the PreReservedSegment. Start Address: 0x%p, Size: 0x%x * 0x%x bytes"
                  ,pvVar1,0x1000,(ulong)uVar2);
  }
  CCLock::~CCLock(&(this->cs).super_CCLock);
  return;
}

Assistant:

PreReservedVirtualAllocWrapper::~PreReservedVirtualAllocWrapper()
{
    if (IsPreReservedRegionPresent())
    {
        BOOL success = VirtualFree(preReservedStartAddress, 0, MEM_RELEASE);
        PreReservedHeapTrace(_u("MEM_RELEASE the PreReservedSegment. Start Address: 0x%p, Size: 0x%x * 0x%x bytes"), preReservedStartAddress, PreReservedAllocationSegmentCount,
            AutoSystemInfo::Data.GetAllocationGranularityPageSize());
        if (!success)
        {
            // OOP JIT TODO: check if we need to cleanup the context related to this content process
        }

#if !TARGET_64 && _CONTROL_FLOW_GUARD
        Assert(numPreReservedSegment > 0);
        InterlockedDecrement(&PreReservedVirtualAllocWrapper::numPreReservedSegment);
#endif
    }
}